

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

DatabaseInterface * Fossilize::create_dumb_folder_database(char *directory_path,DatabaseMode mode)

{
  DumbDirectoryDatabase *this;
  allocator local_41;
  string local_40;
  
  this = (DumbDirectoryDatabase *)operator_new(0x268);
  std::__cxx11::string::string((string *)&local_40,directory_path,&local_41);
  DumbDirectoryDatabase::DumbDirectoryDatabase(this,&local_40,mode);
  std::__cxx11::string::_M_dispose();
  return &this->super_DatabaseInterface;
}

Assistant:

DatabaseInterface *create_dumb_folder_database(const char *directory_path, DatabaseMode mode)
{
	auto *db = new DumbDirectoryDatabase(directory_path, mode);
	return db;
}